

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_seqdiff.cpp
# Opt level: O1

void __thiscall argparse::args_t::parse_input(args_t *this,char *str)

{
  int iVar1;
  FILE *pFVar2;
  
  pFVar2 = _stdin;
  if ((str != (char *)0x0) && (iVar1 = strcmp(str,"-"), pFVar2 = _stdin, iVar1 != 0)) {
    pFVar2 = fopen(str,"rb");
  }
  this->input = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    ERROR("failed to open the INPUT file %s",str);
    return;
  }
  return;
}

Assistant:

void args_t::parse_input( const char * str )
  {
    if ( str && strcmp( str, "-" ) )
      input = fopen( str, "rb" );
    else
      input = stdin;
    
    if ( input == NULL )
      ERROR( "failed to open the INPUT file %s", str );
  }